

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void initialization_suite::init_zero(void)

{
  size_type *psVar1;
  iterator pvVar2;
  iterator pvVar3;
  iterator pvVar4;
  iterator iVar5;
  iterator iVar6;
  int *piVar7;
  iterator iVar8;
  iterator iVar9;
  undefined1 auStack_1b8 [8];
  vector<int,_std::allocator<int>_> expect_3;
  circular_view<int,18446744073709551615ul> local_198 [8];
  circular_view<int,_18446744073709551615UL> span_3;
  undefined1 auStack_148 [8];
  vector<int,_std::allocator<int>_> expect_2;
  circular_view<int,18446744073709551615ul> local_128 [8];
  circular_view<int,_18446744073709551615UL> span_2;
  undefined1 auStack_d8 [8];
  vector<int,_std::allocator<int>_> expect_1;
  circular_view<int,18446744073709551615ul> local_b8 [8];
  circular_view<int,_18446744073709551615UL> span_1;
  undefined1 auStack_58 [8];
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,18446744073709551615ul> local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  
  span.member.next = 0x160000000b;
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)psVar1);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>
            (local_38,pvVar2,pvVar3,pvVar4,0);
  auStack_58 = (undefined1  [8])0x0;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_58);
  iVar8 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar9 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)auStack_58);
  iVar6 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)auStack_58);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x8fe,"void initialization_suite::init_zero()",iVar8,iVar9,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_58);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)psVar1);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  piVar7 = std::next<int*>(pvVar4,1);
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>
            (local_b8,pvVar2,pvVar3,piVar7,0);
  auStack_d8 = (undefined1  [8])0x0;
  expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_d8);
  iVar8 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_b8);
  iVar9 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_b8);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)auStack_d8);
  span_2.member.next =
       (size_type)
       std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)auStack_d8);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x905,"void initialization_suite::init_zero()",iVar8,iVar9,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)span_2.member.next);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_d8);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)psVar1);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  piVar7 = std::next<int*>(pvVar4,2);
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>
            (local_128,pvVar2,pvVar3,piVar7,0);
  auStack_148 = (undefined1  [8])0x0;
  expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_148);
  iVar8 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_128);
  iVar9 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_128);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)auStack_148);
  span_3.member.next =
       (size_type)
       std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)auStack_148)
  ;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x90c,"void initialization_suite::init_zero()",iVar8,iVar9,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)span_3.member.next);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_148);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)psVar1);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  piVar7 = std::next<int*>(pvVar4,3);
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>
            (local_198,pvVar2,pvVar3,piVar7,0);
  auStack_1b8 = (undefined1  [8])0x0;
  expect_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_1b8);
  iVar8 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_198);
  iVar9 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_198);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)auStack_1b8);
  iVar6 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)auStack_1b8);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x913,"void initialization_suite::init_zero()",iVar8,iVar9,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_1b8);
  return;
}

Assistant:

void init_zero()
{
    std::array<int, 4> array = { 11, 22, 33, 44 };
    {
        circular_view<int> span(array.begin(), array.end(), array.begin(), 0);

        std::vector<int> expect = {};
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        circular_view<int> span(array.begin(), array.end(), std::next(array.begin(), 1), 0);

        std::vector<int> expect = {};
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        circular_view<int> span(array.begin(), array.end(), std::next(array.begin(), 2), 0);

        std::vector<int> expect = {};
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        circular_view<int> span(array.begin(), array.end(), std::next(array.begin(), 3), 0);

        std::vector<int> expect = {};
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}